

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_dec.c
# Opt level: O3

int FailReader(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  return 0;
}

Assistant:

static int FailReader(const uint8_t* const data, size_t data_size,
                      struct WebPPicture* const pic,
                      int keep_alpha, struct Metadata* const metadata) {
  (void)data;
  (void)data_size;
  (void)pic;
  (void)keep_alpha;
  (void)metadata;
  return 0;
}